

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkDiagJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  element_type *peVar5;
  Value *pVVar6;
  DiagAnsDataMap *pDVar7;
  NetDiagData *aNetDiagData;
  NetDiagData *aNetDiagData_00;
  NetDiagData *aNetDiagData_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_aa8;
  string local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  Value local_a08;
  reference local_9c0;
  pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *diagAnsDataMap_2;
  iterator __end5;
  iterator __begin5;
  DiagAnsDataMap *__range5;
  DiagAnsDataMap diagAnsDataMaps_2;
  duration<long,_std::ratio<1L,_1000L>_> local_968;
  ErrorCode local_95c;
  Error local_958;
  Value local_930;
  ErrorCode local_8e4;
  Error local_8e0;
  Value local_8b8;
  allocator local_869;
  string local_868;
  string local_848;
  string local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  Value local_7a8;
  reference local_760;
  pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *diagAnsDataMap_1;
  iterator __end4_1;
  iterator __begin4_1;
  DiagAnsDataMap *__range4_1;
  DiagAnsDataMap diagAnsDataMaps_1;
  duration<long,_std::ratio<1L,_1000L>_> local_708;
  ErrorCode local_6fc;
  Error local_6f8;
  Value local_6d0;
  allocator local_681;
  string local_680;
  string local_660;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  Value local_5c0;
  reference local_578;
  pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *diagAnsDataMap;
  iterator __end4;
  iterator __begin4;
  DiagAnsDataMap *__range4;
  DiagAnsDataMap diagAnsDataMaps;
  duration<long,_std::ratio<1L,_1000L>_> local_520;
  ErrorCode local_514;
  Error local_510;
  Value local_4e8;
  allocator local_499;
  string local_498;
  anon_class_1_0_00000001 local_472;
  v10 local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  char *local_468;
  string local_460;
  Error local_440;
  Value local_418;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  anon_class_1_0_00000001 local_36a;
  v10 local_369;
  v10 *local_368;
  char *local_360;
  string local_358;
  Error local_338;
  Value local_310;
  undefined1 local_2c8 [8];
  NetDiagData diagData;
  string dstAddr;
  uint8_t operationType;
  uint64_t flags;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_168 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  char *local_150;
  const_reference local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  char *pcStack_138;
  string *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[18],_char[62]>
  local_128;
  undefined1 local_108 [16];
  v10 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  Value **local_80;
  undefined1 *local_78;
  Value **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  Value **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[18],_char[62]>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[18],_char[62]>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[18],_char[62]>
  *local_10;
  
  Value::Value(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&diagData.mPresentFlags);
  NetDiagData::NetDiagData((NetDiagData *)local_2c8);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  if (sVar2 < 3) {
    ProcessNetworkDiagJob::anon_class_1_0_00000001::operator()(&local_36a);
    local_b8 = &local_368;
    local_c0 = &local_369;
    bVar8 = ::fmt::v10::operator()(local_c0);
    local_360 = (char *)bVar8.size_;
    local_368 = (v10 *)bVar8.data_;
    ::fmt::v10::detail::
    check_format_string<const_char_(&)[18],_const_char_(&)[62],_FMT_COMPILE_STRING,_0>();
    local_c8 = &local_358;
    local_d8 = local_368;
    pcStack_d0 = local_360;
    local_e0 = "too few arguments";
    local_e8 = "netdiag [query] [extaddr | rloc16 ] <dest mesh local address>";
    local_50 = &local_d8;
    local_f8 = local_368;
    local_f0 = local_360;
    local_48 = local_f8;
    pcStack_40 = local_f0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[18],char_const[62]>
              (&local_128,(v10 *)"too few arguments",
               (char (*) [18])"netdiag [query] [extaddr | rloc16 ] <dest mesh local address>",
               (char (*) [62])local_368);
    local_30 = local_108;
    local_38 = &local_128;
    local_20 = 0xcc;
    fmt.size_ = 0xcc;
    fmt.data_ = local_f0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_358,local_f8,fmt,args);
    Error::Error(&local_338,kInvalidArgs,&local_358);
    Value::Value(&local_310,&local_338);
    Value::operator=(__return_storage_ptr__,&local_310);
    Value::~Value(&local_310);
    Error::~Error(&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    goto LAB_0032c305;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  if (sVar2 < 4) {
LAB_0032b08c:
    std::__cxx11::string::clear();
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](aExpr,3);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) goto LAB_0032b08c;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](aExpr,3);
    std::__cxx11::string::operator=((string *)&diagData.mPresentFlags,(string *)pvVar4);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](aExpr,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"query",&local_3a1);
  bVar1 = CaseInsensitiveEqual(pvVar4,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  if (bVar1) {
    dstAddr.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](aExpr,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"reset",&local_3c9);
    bVar1 = CaseInsensitiveEqual(pvVar4,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    if (!bVar1) {
      ProcessNetworkDiagJob::anon_class_1_0_00000001::operator()(&local_472);
      local_a8 = &local_470;
      local_b0 = &local_471;
      bVar8 = ::fmt::v10::operator()(local_b0);
      local_468 = (char *)bVar8.size_;
      local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar8.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_148 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](aExpr,1);
      local_130 = &local_460;
      local_140 = local_470;
      pcStack_138 = local_468;
      local_a0 = &local_140;
      local_158 = local_470;
      local_150 = local_468;
      local_98 = local_158;
      pcStack_90 = local_150;
      value = (Value *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_148,(v10 *)local_130,local_470);
      local_78 = local_168;
      local_80 = &value;
      local_68 = 0xd;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_150;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_80;
      local_70 = local_80;
      local_60 = local_78;
      local_58 = local_80;
      ::fmt::v10::vformat_abi_cxx11_(&local_460,(v10 *)local_158,fmt_00,args_00);
      Error::Error(&local_440,kInvalidCommand,&local_460);
      Value::Value(&local_418,&local_440);
      Value::operator=(__return_storage_ptr__,&local_418);
      Value::~Value(&local_418);
      Error::~Error(&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      goto LAB_0032c305;
    }
    dstAddr.field_2._M_local_buf[0xf] = '\x02';
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](aExpr,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"extaddr",&local_499);
  bVar1 = CaseInsensitiveEqual(pvVar4,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  if ((bVar1) && (dstAddr.field_2._M_local_buf[0xf] == '\x01')) {
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aCommissioner);
    (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
              (&local_510,peVar5,&diagData.mPresentFlags,1);
    Value::Value(&local_4e8,&local_510);
    pVVar6 = Value::operator=(__return_storage_ptr__,&local_4e8);
    local_514 = kNone;
    bVar1 = Value::operator!=(pVVar6,&local_514);
    Value::~Value(&local_4e8);
    Error::~Error(&local_510);
    if (bVar1) goto LAB_0032c305;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_520,
               (int *)((long)&diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_node_count + 4))
    ;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_520);
    diagData.mChildIpv6AddrsInfoList.
    super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aCommissioner);
    pDVar7 = CommissionerApp::GetNetDiagTlvs(peVar5);
    std::
    map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
    ::map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
           *)&__range4,pDVar7);
    __end4 = std::
             map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
             ::begin((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                      *)&__range4);
    diagAnsDataMap =
         (pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *)
         std::
         map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
         ::end((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                *)&__range4);
    while (bVar1 = std::operator!=(&__end4,(_Self *)&diagAnsDataMap), bVar1) {
      local_578 = std::
                  _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
                  ::operator*(&__end4);
      Address::ToString_abi_cxx11_(&local_640,&local_578->first);
      std::operator+(&local_620,"Peer Address: ",&local_640);
      std::operator+(&local_600,&local_620,"\nContent: ");
      NetDiagDataToJson_abi_cxx11_(&local_660,(commissioner *)&local_578->second,aNetDiagData);
      std::operator+(&local_5e0,&local_600,&local_660);
      Value::Value(&local_5c0,&local_5e0);
      Value::operator=(__return_storage_ptr__,&local_5c0);
      Value::~Value(&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      std::
      _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
      ::operator++(&__end4);
    }
    std::
    map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
    ::~map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
            *)&__range4);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](aExpr,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"rloc16",&local_681);
  bVar1 = CaseInsensitiveEqual(pvVar4,&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  if ((bVar1) && (dstAddr.field_2._M_local_buf[0xf] == '\x01')) {
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aCommissioner);
    (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
              (&local_6f8,peVar5,&diagData.mPresentFlags,2);
    Value::Value(&local_6d0,&local_6f8);
    pVVar6 = Value::operator=(__return_storage_ptr__,&local_6d0);
    local_6fc = kNone;
    bVar1 = Value::operator!=(pVVar6,&local_6fc);
    Value::~Value(&local_6d0);
    Error::~Error(&local_6f8);
    if (bVar1) goto LAB_0032c305;
    diagAnsDataMaps_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_708,
               (int *)((long)&diagAnsDataMaps_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 4
                      ));
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_708);
    diagData.mChildIpv6AddrsInfoList.
    super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aCommissioner);
    pDVar7 = CommissionerApp::GetNetDiagTlvs(peVar5);
    std::
    map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
    ::map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
           *)&__range4_1,pDVar7);
    __end4_1 = std::
               map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
               ::begin((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                        *)&__range4_1);
    diagAnsDataMap_1 =
         (pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *)
         std::
         map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
         ::end((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                *)&__range4_1);
    while (bVar1 = std::operator!=(&__end4_1,(_Self *)&diagAnsDataMap_1), bVar1) {
      local_760 = std::
                  _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
                  ::operator*(&__end4_1);
      Address::ToString_abi_cxx11_(&local_828,&local_760->first);
      std::operator+(&local_808,"Peer Address: ",&local_828);
      std::operator+(&local_7e8,&local_808,"\nContent: ");
      NetDiagDataToJson_abi_cxx11_(&local_848,(commissioner *)&local_760->second,aNetDiagData_00);
      std::operator+(&local_7c8,&local_7e8,&local_848);
      Value::Value(&local_7a8,&local_7c8);
      Value::operator=(__return_storage_ptr__,&local_7a8);
      Value::~Value(&local_7a8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      std::
      _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
      ::operator++(&__end4_1);
    }
    std::
    map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
    ::~map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
            *)&__range4_1);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](aExpr,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_868,"maccounters",&local_869);
  bVar1 = CaseInsensitiveEqual(pvVar4,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  if (bVar1) {
    if (dstAddr.field_2._M_local_buf[0xf] == '\x02') {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)aCommissioner);
      (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x36])
                (&local_8e0,peVar5,&diagData.mPresentFlags,0x100);
      Value::Value(&local_8b8,&local_8e0);
      pVVar6 = Value::operator=(__return_storage_ptr__,&local_8b8);
      local_8e4 = kNone;
      Value::operator!=(pVVar6,&local_8e4);
      Value::~Value(&local_8b8);
      Error::~Error(&local_8e0);
    }
    else if (dstAddr.field_2._M_local_buf[0xf] == '\x01') {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)aCommissioner);
      (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                (&local_958,peVar5,&diagData.mPresentFlags,0x100);
      Value::Value(&local_930,&local_958);
      pVVar6 = Value::operator=(__return_storage_ptr__,&local_930);
      local_95c = kNone;
      bVar1 = Value::operator!=(pVVar6,&local_95c);
      Value::~Value(&local_930);
      Error::~Error(&local_958);
      if (!bVar1) {
        diagAnsDataMaps_2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1000;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_968,
                   (int *)((long)&diagAnsDataMaps_2._M_t._M_impl.super__Rb_tree_header._M_node_count
                          + 4));
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_968);
        diagData.mChildIpv6AddrsInfoList.
        super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100;
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)aCommissioner);
        pDVar7 = CommissionerApp::GetNetDiagTlvs(peVar5);
        std::
        map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
               *)&__range5,pDVar7);
        __end5 = std::
                 map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                 ::begin((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                          *)&__range5);
        diagAnsDataMap_2 =
             (pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData> *)
             std::
             map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
             ::end((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                    *)&__range5);
        while (bVar1 = std::operator!=(&__end5,(_Self *)&diagAnsDataMap_2), bVar1) {
          local_9c0 = std::
                      _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
                      ::operator*(&__end5);
          Address::ToString_abi_cxx11_(&local_a88,&local_9c0->first);
          std::operator+(&local_a68,"Peer Address: ",&local_a88);
          std::operator+(&local_a48,&local_a68,"\nContent: ");
          NetDiagDataToJson_abi_cxx11_
                    (&local_aa8,(commissioner *)&local_9c0->second,aNetDiagData_01);
          std::operator+(&local_a28,&local_a48,&local_aa8);
          Value::Value(&local_a08,&local_a28);
          Value::operator=(__return_storage_ptr__,&local_a08);
          Value::~Value(&local_a08);
          std::__cxx11::string::~string((string *)&local_a28);
          std::__cxx11::string::~string((string *)&local_aa8);
          std::__cxx11::string::~string((string *)&local_a48);
          std::__cxx11::string::~string((string *)&local_a68);
          std::__cxx11::string::~string((string *)&local_a88);
          std::
          _Rb_tree_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>
          ::operator++(&__end5);
        }
        std::
        map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::~map((map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                *)&__range5);
      }
    }
  }
LAB_0032c305:
  NetDiagData::~NetDiagData((NetDiagData *)local_2c8);
  std::__cxx11::string::~string((string *)&diagData.mPresentFlags);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkDiagJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value       value;
    uint64_t    flags         = 0;
    uint8_t     operationType = 0;
    std::string dstAddr;
    NetDiagData diagData;

    VerifyOrExit(aExpr.size() >= 3,
                 value = ERROR_INVALID_ARGS("{} \n {}", SYNTAX_FEW_ARGS,
                                            "netdiag [query] [extaddr | rloc16 ] <dest mesh local address>"));
    if (aExpr.size() > 3 && !aExpr[3].empty())
    {
        dstAddr = aExpr[3];
    }
    else
    {
        dstAddr.clear();
    }

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        operationType = DIAG_GET_QRY_TYPE;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "reset"))
    {
        operationType = DIAG_RST_NTF_TYPE;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (CaseInsensitiveEqual(aExpr[2], "extaddr"))
    {
        flags = NetDiagData::kExtMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "rloc16"))
    {
        flags = NetDiagData::kMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "maccounters"))
    {
        flags = NetDiagData::kMacCountersBit;
        if (operationType == DIAG_RST_NTF_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagReset(dstAddr, flags));
        }
        else if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }

exit:
    return value;
}